

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O1

void __thiscall brown::MySimulator::moveLinear(MySimulator *this,int dx,int dy,bool isDown)

{
  _Map_pointer pplVar1;
  long *plVar2;
  long *plVar3;
  int64_t *piVar4;
  uint uVar5;
  MySimulator *pMVar6;
  int iVar7;
  int iVar8;
  long *plVar9;
  bool pulx;
  long lVar10;
  _Deque_base<long,_std::allocator<long>_> *p_Var11;
  _Deque_base<long,_std::allocator<long>_> *p_Var12;
  uint uVar13;
  int iVar14;
  long lVar15;
  deque<long,std::allocator<long>> *this_00;
  long tt;
  long lVar16;
  int64_t vt;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt2s;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt1s;
  int local_120;
  int local_11c;
  long local_118;
  int local_10c;
  MySimulator *local_108;
  float local_fc;
  uint local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  uint local_e8;
  uint local_e4;
  int64_t local_e0;
  _Deque_base<long,_std::allocator<long>_> local_d8;
  _Deque_base<long,_std::allocator<long>_> local_88;
  
  if (dy != 0 || dx != 0) {
    local_e4 = -dx;
    if (0 < dx) {
      local_e4 = dx;
    }
    local_e8 = -dy;
    if (0 < dy) {
      local_e8 = dy;
    }
    uVar13 = local_e8;
    if (local_e8 < local_e4) {
      uVar13 = local_e4;
    }
    uVar5 = local_e8;
    if (local_e4 < local_e8) {
      uVar5 = local_e4;
    }
    local_10c = (this->super_Simulator).PULPERPIX;
    iVar14 = uVar13 * local_10c;
    local_10c = local_10c * uVar5;
    lVar16 = 0;
    if (uVar5 == 0) {
      local_fc = -1.0;
      lVar16 = 0x7fffffffffffffff;
    }
    else {
      local_fc = (float)iVar14 / (float)local_10c;
    }
    local_e0 = this->clk;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<long,_std::allocator<long>_>::_M_initialize_map(&local_88,0);
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<long,_std::allocator<long>_>::_M_initialize_map(&local_d8,0);
    local_f8 = (uint)isDown;
    local_f4 = iVar14;
    if (0 < local_10c || 0 < iVar14) {
      local_120 = 0;
      local_11c = 0;
      lVar15 = 0;
      local_108 = this;
      local_f0 = dy;
      local_ec = dx;
      do {
        iVar14 = local_10c;
        if (lVar15 <= lVar16) {
          iVar14 = local_f4;
        }
        this_00 = (deque<long,std::allocator<long>> *)&local_d8;
        if (lVar15 <= lVar16) {
          this_00 = (deque<long,std::allocator<long>> *)&local_88;
        }
        tt = lVar16;
        if (lVar15 < lVar16) {
          tt = lVar15;
        }
        pulx = lVar15 <= lVar16 != local_e4 <= local_e8;
        this->clk = local_e0 + tt;
        Simulator::setpin(&this->super_Simulator,local_e0 + tt,pulx,!pulx,0 < local_ec,0 < local_f0,
                          SUB41(local_f8,0));
        pMVar6 = local_108;
        iVar8 = local_11c;
        if (lVar16 < lVar15) {
          iVar8 = local_120;
        }
        iVar8 = iVar8 + 1;
        iVar7 = iVar8;
        if (lVar16 < lVar15) {
          local_120 = iVar8;
          iVar7 = local_11c;
        }
        local_11c = iVar7;
        if (iVar14 - iVar8 == 0 || iVar14 < iVar8) {
          if (lVar16 < lVar15) {
            lVar16 = 0x7fffffffffffffff;
            lVar10 = lVar15;
          }
          else {
            lVar10 = 0x7fffffffffffffff;
          }
        }
        else {
          local_118 = 0;
          p_Var12 = &local_88;
          if (lVar16 < lVar15) {
            p_Var12 = &local_d8;
          }
          pplVar1 = (p_Var12->_M_impl).super__Deque_impl_data._M_finish._M_node;
          plVar9 = (p_Var12->_M_impl).super__Deque_impl_data._M_finish._M_cur;
          plVar2 = (p_Var12->_M_impl).super__Deque_impl_data._M_finish._M_first;
          plVar3 = (p_Var12->_M_impl).super__Deque_impl_data._M_start._M_cur;
          if (((long)(p_Var12->_M_impl).super__Deque_impl_data._M_start._M_last - (long)plVar3 >> 3)
              + ((long)plVar9 - (long)plVar2 >> 3) +
              ((((ulong)((long)pplVar1 -
                        (long)(p_Var12->_M_impl).super__Deque_impl_data._M_start._M_node) >> 3) - 1)
              + (ulong)(pplVar1 == (_Map_pointer)0x0)) * 0x40 < (ulong)(long)(iVar14 - iVar8)) {
            if (plVar9 != plVar3) {
              if (plVar9 == plVar2) {
                plVar9 = pplVar1[-1] + 0x40;
              }
              lVar10 = (long)(local_108->super_Simulator).MINT;
              if (plVar9[-1] <= lVar10) goto LAB_001057f7;
            }
            local_118 = linearSpeedCurve(local_108,tt);
            lVar10 = (long)(pMVar6->super_Simulator).MINT;
            if (local_118 <= lVar10) {
              local_118 = lVar10;
            }
            p_Var11 = &local_d8;
            if (lVar15 <= lVar16) {
              p_Var11 = &local_88;
            }
            piVar4 = (p_Var12->_M_impl).super__Deque_impl_data._M_finish._M_cur;
            if (piVar4 == (p_Var11->_M_impl).super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                        (this_00,&local_118);
              lVar10 = local_118;
            }
            else {
              *piVar4 = local_118;
              (p_Var12->_M_impl).super__Deque_impl_data._M_finish._M_cur = piVar4 + 1;
              lVar10 = local_118;
            }
          }
          else {
            if (plVar9 == plVar2) {
              plVar9 = pplVar1[-1] + 0x40;
            }
            local_118 = plVar9[-1];
            std::deque<long,_std::allocator<long>_>::pop_back
                      ((deque<long,_std::allocator<long>_> *)this_00);
            lVar10 = local_118;
          }
LAB_001057f7:
          local_118 = lVar10;
          if (lVar16 < lVar15) {
            local_118 = (long)((float)local_118 * local_fc);
          }
          this = local_108;
          lVar10 = tt + local_118;
          if (lVar16 < lVar15) {
            lVar10 = lVar15;
            lVar16 = tt + local_118;
          }
        }
        lVar15 = lVar10;
      } while ((local_11c < local_f4) || (dy = local_f0, dx = local_ec, local_120 < local_10c));
    }
    lVar16 = (long)(this->super_Simulator).MAXT + this->clk;
    this->clk = lVar16;
    Simulator::setpin(&this->super_Simulator,lVar16,false,false,0 < dx,0 < dy,SUB41(local_f8,0));
    std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_d8);
    std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_88);
  }
  return;
}

Assistant:

void MySimulator::moveLinear(int dx, int dy, bool isDown) {
    if (dx == 0 && dy == 0) {
        return;
    }

    // direction and displacement
    bool dirx = (dx > 0);
    bool diry = (dy > 0);
    dx = std::abs(dx);
    dy = std::abs(dy);

    // determine primary/long and secondary/short axis
    bool isxmain = (dx > dy);
    int d1px = (isxmain ? dx : dy);
    int d2px = (isxmain ? dy : dx);
    bool d2is0 = (d2px == 0);

    // target steps and ratio
    int d1step = d1px * PULPERPIX;
    int d2step = d2px * PULPERPIX;
    float tg = d2is0? -1 : static_cast<float>(d1step)/d2step;

    // step keeping
    int s1 = 0;
    int s2 = 0;

    // time keeping
    std::int64_t startTick = clk;
    std::int64_t t1 = 0;
    std::int64_t t2 = d2is0 ? std::numeric_limits<std::int64_t>::max() : 0;

    // speed history
    std::stack<std::int64_t> vt1s;
    std::stack<std::int64_t> vt2s;

    while ((s1 < d1step) || (s2 < d2step)) {
        // determine driving axis
        bool ismain = (t1 <= t2);
        int& s = ismain ? s1 : s2;
        int dstep = ismain ? d1step : d2step;
        bool isx = (ismain == isxmain);
        std::int64_t& t = ismain ? t1 : t2;
        std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;

        // step
        clk = startTick + t;
        setpin(clk, isx, !isx, dirx, diry, isDown);
        if (++s >= dstep) {
            t = std::numeric_limits<std::int64_t>::max();
            continue;
        }

        // set next step interval
        std::int64_t vt = 0;
        if (vts.size() >= (dstep - s)) { // decelerate
            vt = vts.top();
            vts.pop();
        } else if (vts.empty() || (vts.top() > MINT)) { // accelerate
            vt = linearSpeedCurve(t);
            if (vt < MINT) { // speeding
                vt = MINT;
            }
            vts.push(vt);
        } else { // hold
            vt = MINT;
        }

        // adjust speed on secondary axis
        if (!ismain) {
            vt *= tg;
        }
        t += vt;
    }

    // delay, a time gap between line drawings
    clk += MAXT;
    setpin(clk, false, false, dirx, diry, isDown);
}